

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfocusframe.cpp
# Opt level: O2

void __thiscall QFocusFramePrivate::updateSize(QFocusFramePrivate *this)

{
  QWidget *this_00;
  QWidget *parent;
  QWidget *this_01;
  QWidgetData *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Representation RVar5;
  Representation RVar6;
  QStyle *pQVar7;
  QWidget *pQVar8;
  long in_FS_OFFSET;
  QStyleHintReturnMask local_a8;
  QRect local_90;
  QPoint local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->widget != (QWidget *)0x0) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
    (**(code **)(*(long *)this_00 + 0x1a0))(this_00,(QStyleOption *)local_78);
    pQVar7 = QWidget::style(this_00);
    iVar3 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x40,(QStyleOption *)local_78,this_00);
    pQVar7 = QWidget::style(this_00);
    iVar4 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x41,(QStyleOption *)local_78,this_00);
    RVar5.m_i = QWidget::x(this->widget);
    RVar6.m_i = QWidget::y(this->widget);
    local_80.yp.m_i = RVar6.m_i;
    local_80.xp.m_i = RVar5.m_i;
    parent = *(QWidget **)(*(long *)&this_00->field_0x8 + 0x10);
    pQVar8 = this->widget;
    this_01 = *(QWidget **)(*(long *)&pQVar8->field_0x8 + 0x10);
    if (parent != this_01) {
      local_80 = QWidget::mapTo(this_01,parent,&local_80);
      RVar5 = local_80.xp.m_i;
      RVar6 = local_80.yp.m_i;
      pQVar8 = this->widget;
    }
    local_90.x1.m_i = RVar5.m_i - iVar4;
    pQVar1 = pQVar8->data;
    local_90.y1.m_i = RVar6.m_i - iVar3;
    local_90.x2.m_i =
         (local_90.x1.m_i + iVar4 * 2 + (pQVar1->crect).x2.m_i) - (pQVar1->crect).x1.m_i;
    local_90.y2.m_i =
         (local_90.y1.m_i + iVar3 * 2 + (pQVar1->crect).y2.m_i) - (pQVar1->crect).y1.m_i;
    bVar2 = ::comparesEqual(&this_00->data->crect,&local_90);
    if (!bVar2) {
      QWidget::setGeometry(this_00,&local_90);
      local_68 = (undefined1  [16])QWidget::rect(this_00);
      local_a8.super_QStyleHintReturn = (QStyleHintReturn)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.region.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QStyleHintReturnMask::QStyleHintReturnMask(&local_a8);
      pQVar7 = QWidget::style(this_00);
      iVar3 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x35,local_78,this_00,&local_a8);
      if (iVar3 != 0) {
        QWidget::setMask(this_00,&local_a8.region);
      }
      QStyleHintReturnMask::~QStyleHintReturnMask(&local_a8);
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFocusFramePrivate::updateSize()
{
    Q_Q(QFocusFrame);
    if (!widget)
        return;

    QStyleOption opt;
    q->initStyleOption(&opt);
    int vmargin = q->style()->pixelMetric(QStyle::PM_FocusFrameVMargin, &opt, q),
        hmargin = q->style()->pixelMetric(QStyle::PM_FocusFrameHMargin, &opt, q);
    QPoint pos(widget->x(), widget->y());
    if (q->parentWidget() != widget->parentWidget())
        pos = widget->parentWidget()->mapTo(q->parentWidget(), pos);
    QRect geom(pos.x()-hmargin, pos.y()-vmargin,
               widget->width()+(hmargin*2), widget->height()+(vmargin*2));
    if (q->geometry() == geom)
        return;

    q->setGeometry(geom);

    opt.rect = q->rect();
    QStyleHintReturnMask mask;
    if (q->style()->styleHint(QStyle::SH_FocusFrame_Mask, &opt, q, &mask))
        q->setMask(mask.region);
}